

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcore.c
# Opt level: O1

void EndDrawing(void)

{
  AutomationEvent *pAVar1;
  AutomationEventList *pAVar2;
  undefined1 __ptr [8];
  uchar *pixelData;
  char *pcVar3;
  uint uVar4;
  long lVar5;
  int gamepad;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  Vector2 scale;
  undefined1 local_50 [8];
  int local_48;
  
  rlDrawRenderBatch(RLGL.currentBatch);
  if (gifRecording == '\x01') {
    gifFrameCounter = (int)(long)((float)CORE.Time.frame * 1000.0) + gifFrameCounter;
    if (100 < gifFrameCounter) {
      local_50 = (undefined1  [8])0x0;
      glfwGetWindowContentScale(platform.handle,(float *)local_50,(float *)(local_50 + 4));
      fVar11 = local_50._0_4_;
      pixelData = rlReadScreenPixels((int)((float)CORE.Window.render.width * fVar11),
                                     (int)(local_50._4_4_ * (float)CORE.Window.render.height));
      msf_gif_frame(&gifState,pixelData,gifFrameCounter / 10,0x10,
                    (int)((float)CORE.Window.render.width * fVar11) << 2);
      gifFrameCounter = gifFrameCounter - 100;
      free(pixelData);
    }
    dVar13 = glfwGetTime();
    if (((int)(dVar13 + dVar13) & 0x80000001U) == 1) {
      DrawCircle(0x1e,CORE.Window.screen.height - 0x14,10.0,(Color)0xff3721be);
      DrawText("GIF RECORDING",0x32,CORE.Window.screen.height - 0x19,10,(Color)0xff3729e6);
    }
    rlDrawRenderBatch(RLGL.currentBatch);
  }
  if ((automationEventRecording == '\x01') &&
     (currentEventList->count != currentEventList->capacity)) {
    uVar6 = 0;
    bVar9 = false;
    do {
      pAVar2 = currentEventList;
      if ((CORE.Input.Keyboard.previousKeyState[uVar6] != '\0') &&
         (CORE.Input.Keyboard.currentKeyState[uVar6] == '\0')) {
        currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
        pAVar2->events[pAVar2->count].type = 1;
        pAVar2->events[pAVar2->count].params[0] = (int)uVar6;
        pAVar2->events[pAVar2->count].params[1] = 0;
        pAVar2->events[pAVar2->count].params[2] = 0;
        pAVar1 = pAVar2->events;
        uVar4 = pAVar2->count;
        TraceLog(3,"AUTOMATION: Frame: %i | Event type: INPUT_KEY_UP | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                 (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
        currentEventList->count = currentEventList->count + 1;
      }
      pAVar2 = currentEventList;
      if (currentEventList->count == currentEventList->capacity) {
LAB_00171569:
        if (!bVar9) goto LAB_00171e13;
        break;
      }
      if (CORE.Input.Keyboard.currentKeyState[uVar6] != '\0') {
        currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
        pAVar2->events[pAVar2->count].type = 2;
        pAVar2->events[pAVar2->count].params[0] = (int)uVar6;
        pAVar2->events[pAVar2->count].params[1] = 0;
        pAVar2->events[pAVar2->count].params[2] = 0;
        pAVar1 = pAVar2->events;
        uVar4 = pAVar2->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_KEY_DOWN | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                 (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
        currentEventList->count = currentEventList->count + 1;
      }
      if (currentEventList->count == currentEventList->capacity) goto LAB_00171569;
      bVar9 = 0x1fe < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 0x200);
    uVar6 = 0;
    bVar9 = false;
    do {
      pAVar2 = currentEventList;
      if ((CORE.Input.Mouse.previousButtonState[uVar6] != '\0') &&
         (CORE.Input.Mouse.currentButtonState[uVar6] == '\0')) {
        currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
        pAVar2->events[pAVar2->count].type = 5;
        pAVar2->events[pAVar2->count].params[0] = (int)uVar6;
        pAVar2->events[pAVar2->count].params[1] = 0;
        pAVar2->events[pAVar2->count].params[2] = 0;
        pAVar1 = pAVar2->events;
        uVar4 = pAVar2->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_BUTTON_UP | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                 (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
        currentEventList->count = currentEventList->count + 1;
      }
      pAVar2 = currentEventList;
      if (currentEventList->count == currentEventList->capacity) {
LAB_0017170d:
        if (!bVar9) goto LAB_00171e13;
        break;
      }
      if (CORE.Input.Mouse.currentButtonState[uVar6] != '\0') {
        currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
        pAVar2->events[pAVar2->count].type = 6;
        pAVar2->events[pAVar2->count].params[0] = (int)uVar6;
        pAVar2->events[pAVar2->count].params[1] = 0;
        pAVar2->events[pAVar2->count].params[2] = 0;
        pAVar1 = pAVar2->events;
        uVar4 = pAVar2->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_BUTTON_DOWN | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                 (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
        currentEventList->count = currentEventList->count + 1;
      }
      if (currentEventList->count == currentEventList->capacity) goto LAB_0017170d;
      bVar9 = 6 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 8);
    pAVar2 = currentEventList;
    if (((int)CORE.Input.Mouse.currentPosition.x != (int)CORE.Input.Mouse.previousPosition.x) ||
       ((int)CORE.Input.Mouse.currentPosition.y != (int)CORE.Input.Mouse.previousPosition.y)) {
      currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
      pAVar2->events[pAVar2->count].type = 7;
      pAVar2->events[pAVar2->count].params[0] = (int)CORE.Input.Mouse.currentPosition.x;
      pAVar2->events[pAVar2->count].params[1] = (int)CORE.Input.Mouse.currentPosition.y;
      pAVar2->events[pAVar2->count].params[2] = 0;
      pAVar1 = pAVar2->events;
      uVar4 = pAVar2->count;
      TraceLog(3,
               "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_POSITION | Event parameters: %i, %i, %i"
               ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
               (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
      pAVar2 = currentEventList;
      uVar4 = currentEventList->count + 1;
      currentEventList->count = uVar4;
      if (uVar4 == pAVar2->capacity) goto LAB_00171e13;
    }
    pAVar2 = currentEventList;
    if (((int)CORE.Input.Mouse.currentWheelMove.x != (int)CORE.Input.Mouse.previousWheelMove.x) ||
       ((int)CORE.Input.Mouse.currentWheelMove.y != (int)CORE.Input.Mouse.previousWheelMove.y)) {
      currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
      pAVar2->events[pAVar2->count].type = 8;
      pAVar2->events[pAVar2->count].params[0] = (int)CORE.Input.Mouse.currentWheelMove.x;
      pAVar2->events[pAVar2->count].params[1] = (int)CORE.Input.Mouse.currentWheelMove.y;
      pAVar2->events[pAVar2->count].params[2] = 0;
      pAVar1 = pAVar2->events;
      uVar4 = pAVar2->count;
      TraceLog(3,
               "AUTOMATION: Frame: %i | Event type: INPUT_MOUSE_WHEEL_MOTION | Event parameters: %i, %i, %i"
               ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
               (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
      pAVar2 = currentEventList;
      uVar4 = currentEventList->count + 1;
      currentEventList->count = uVar4;
      if (uVar4 == pAVar2->capacity) goto LAB_00171e13;
    }
    uVar6 = 0;
    bVar9 = false;
    do {
      pAVar2 = currentEventList;
      if ((CORE.Input.Touch.previousTouchState[uVar6] != '\0') &&
         (CORE.Input.Touch.currentTouchState[uVar6] == '\0')) {
        currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
        pAVar2->events[pAVar2->count].type = 0xe;
        pAVar2->events[pAVar2->count].params[0] = (int)uVar6;
        pAVar2->events[pAVar2->count].params[1] = 0;
        pAVar2->events[pAVar2->count].params[2] = 0;
        pAVar1 = pAVar2->events;
        uVar4 = pAVar2->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_TOUCH_UP | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                 (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
        currentEventList->count = currentEventList->count + 1;
      }
      pAVar2 = currentEventList;
      if (currentEventList->count == currentEventList->capacity) {
LAB_00171a73:
        if (!bVar9) goto LAB_00171e13;
        break;
      }
      if (CORE.Input.Touch.currentTouchState[uVar6] != '\0') {
        currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
        pAVar2->events[pAVar2->count].type = 0xf;
        pAVar2->events[pAVar2->count].params[0] = (int)uVar6;
        pAVar2->events[pAVar2->count].params[1] = 0;
        pAVar2->events[pAVar2->count].params[2] = 0;
        pAVar1 = pAVar2->events;
        uVar4 = pAVar2->count;
        TraceLog(3,
                 "AUTOMATION: Frame: %i | Event type: INPUT_TOUCH_DOWN | Event parameters: %i, %i, %i"
                 ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                 (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
        currentEventList->count = currentEventList->count + 1;
      }
      if (currentEventList->count == currentEventList->capacity) goto LAB_00171a73;
      bVar9 = 6 < uVar6;
      uVar6 = uVar6 + 1;
    } while (uVar6 != 8);
    bVar9 = true;
    lVar8 = 0x23b4a0;
    lVar5 = 0x23b5a0;
    uVar6 = 0;
    do {
      uVar7 = 0;
      bVar10 = false;
      do {
        pAVar2 = currentEventList;
        gamepad = (int)uVar6;
        if ((*(char *)(lVar8 + 0x80 + uVar7) != '\0') && (*(char *)(lVar8 + uVar7) == '\0')) {
          currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
          pAVar2->events[pAVar2->count].type = 0xb;
          pAVar2->events[pAVar2->count].params[0] = gamepad;
          pAVar2->events[pAVar2->count].params[1] = (int)uVar7;
          pAVar2->events[pAVar2->count].params[2] = 0;
          pAVar1 = pAVar2->events;
          uVar4 = pAVar2->count;
          TraceLog(3,
                   "AUTOMATION: Frame: %i | Event type: INPUT_GAMEPAD_BUTTON_UP | Event parameters: %i, %i, %i"
                   ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                   (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
          currentEventList->count = currentEventList->count + 1;
        }
        pAVar2 = currentEventList;
        if (currentEventList->count == currentEventList->capacity) {
LAB_00171c2a:
          if (!bVar10) goto LAB_00171d65;
          break;
        }
        if (*(char *)(lVar8 + uVar7) != '\0') {
          currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
          pAVar2->events[pAVar2->count].type = 0xc;
          pAVar2->events[pAVar2->count].params[0] = gamepad;
          pAVar2->events[pAVar2->count].params[1] = (int)uVar7;
          pAVar2->events[pAVar2->count].params[2] = 0;
          pAVar1 = pAVar2->events;
          uVar4 = pAVar2->count;
          TraceLog(3,
                   "AUTOMATION: Frame: %i | Event type: INPUT_GAMEPAD_BUTTON_DOWN | Event parameters: %i, %i, %i"
                   ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                   (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
          currentEventList->count = currentEventList->count + 1;
        }
        if (currentEventList->count == currentEventList->capacity) goto LAB_00171c2a;
        bVar10 = 0x1e < uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 0x20);
      uVar7 = 0;
      bVar10 = false;
      do {
        uVar4 = (uint)uVar7;
        fVar11 = -1.0;
        if ((uVar4 & 6) != 4) {
          fVar11 = 0.0;
        }
        fVar12 = GetGamepadAxisMovement(gamepad,uVar4);
        pAVar2 = currentEventList;
        if ((fVar12 != fVar11) || (NAN(fVar12) || NAN(fVar11))) {
          currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
          pAVar2->events[pAVar2->count].type = 0xd;
          pAVar2->events[pAVar2->count].params[0] = gamepad;
          pAVar2->events[pAVar2->count].params[1] = uVar4;
          pAVar2->events[pAVar2->count].params[2] = (int)(*(float *)(lVar5 + uVar7 * 4) * 32768.0);
          pAVar1 = pAVar2->events;
          uVar4 = pAVar2->count;
          TraceLog(3,
                   "AUTOMATION: Frame: %i | Event type: INPUT_GAMEPAD_AXIS_MOTION | Event parameters: %i, %i, %i"
                   ,(ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
                   (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
          currentEventList->count = currentEventList->count + 1;
        }
        if (currentEventList->count == currentEventList->capacity) {
          if (!bVar10) goto LAB_00171d65;
          break;
        }
        bVar10 = 6 < uVar7;
        uVar7 = uVar7 + 1;
      } while (uVar7 != 8);
      bVar9 = uVar6 < 3;
      uVar6 = uVar6 + 1;
      lVar8 = lVar8 + 0x20;
      lVar5 = lVar5 + 0x20;
    } while (uVar6 != 4);
LAB_00171d65:
    pAVar2 = currentEventList;
    uVar4 = GESTURES.current;
    if (GESTURES.current != 0 && !bVar9) {
      currentEventList->events[currentEventList->count].frame = CORE.Time.frameCounter;
      pAVar2->events[pAVar2->count].type = 0x11;
      pAVar2->events[pAVar2->count].params[0] = uVar4;
      pAVar2->events[pAVar2->count].params[1] = 0;
      pAVar2->events[pAVar2->count].params[2] = 0;
      pAVar1 = pAVar2->events;
      uVar4 = pAVar2->count;
      TraceLog(3,"AUTOMATION: Frame: %i | Event type: INPUT_GESTURE | Event parameters: %i, %i, %i",
               (ulong)pAVar1[uVar4].frame,(ulong)(uint)pAVar1[uVar4].params[0],
               (ulong)(uint)pAVar1[uVar4].params[1],(ulong)(uint)pAVar1[uVar4].params[2]);
      currentEventList->count = currentEventList->count + 1;
    }
  }
LAB_00171e13:
  glfwSwapBuffers(platform.handle);
  CORE.Time.current = glfwGetTime();
  CORE.Time.draw = CORE.Time.current - CORE.Time.previous;
  CORE.Time.frame = CORE.Time.draw + CORE.Time.update;
  CORE.Time.previous = CORE.Time.current;
  if (CORE.Time.frame < CORE.Time.target) {
    CORE.Time.previous = CORE.Time.current;
    WaitTime(CORE.Time.target - CORE.Time.frame);
    dVar13 = glfwGetTime();
    CORE.Time.frame = (dVar13 - CORE.Time.previous) + CORE.Time.frame;
    CORE.Time.previous = dVar13;
  }
  CORE.Time.current = CORE.Time.previous;
  PollInputEvents();
  if ((CORE.Input.Keyboard.previousKeyState[0x12d] == '\0') &&
     (CORE.Input.Keyboard.currentKeyState[0x12d] == '\x01')) {
    if (CORE.Input.Keyboard.currentKeyState[0x155] == '\x01') {
      if (gifRecording == '\x01') {
        gifRecording = '\0';
        msf_gif_end((MsfGifResult *)local_50,&gifState);
        pcVar3 = TextFormat("%s/screenrec%03i.gif",CORE.Storage.basePath,
                            (ulong)(uint)screenshotCounter);
        __ptr = local_50;
        SaveFileData(pcVar3,(void *)local_50,local_48);
        if (__ptr != (undefined1  [8])0x0) {
          free((void *)__ptr);
        }
        TraceLog(3,"SYSTEM: Finish animated GIF recording");
      }
      else {
        gifRecording = '\x01';
        gifFrameCounter = 0;
        local_50 = (undefined1  [8])0x0;
        glfwGetWindowContentScale(platform.handle,(float *)local_50,(float *)(local_50 + 4));
        msf_gif_begin(&gifState,(int)((float)CORE.Window.render.width * local_50._0_4_),
                      (int)(local_50._4_4_ * (float)CORE.Window.render.height));
        screenshotCounter = screenshotCounter + 1;
        pcVar3 = TextFormat("screenrec%03i.gif");
        TraceLog(3,"SYSTEM: Start animated GIF recording: %s",pcVar3);
      }
    }
    else {
      pcVar3 = TextFormat("screenshot%03i.png",(ulong)(uint)screenshotCounter);
      TakeScreenshot(pcVar3);
      screenshotCounter = screenshotCounter + 1;
    }
  }
  CORE.Time.frameCounter = CORE.Time.frameCounter + 1;
  return;
}

Assistant:

void EndDrawing(void)
{
    rlDrawRenderBatchActive();      // Update and draw internal render batch

#if defined(SUPPORT_GIF_RECORDING)
    // Draw record indicator
    if (gifRecording)
    {
        #ifndef GIF_RECORD_FRAMERATE
        #define GIF_RECORD_FRAMERATE    10
        #endif
        gifFrameCounter += (unsigned int)(GetFrameTime()*1000);

        // NOTE: We record one gif frame depending on the desired gif framerate
        if (gifFrameCounter > 1000/GIF_RECORD_FRAMERATE)
        {
            // Get image data for the current frame (from backbuffer)
            // NOTE: This process is quite slow... :(
            Vector2 scale = GetWindowScaleDPI();
            unsigned char *screenData = rlReadScreenPixels((int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y));

            #ifndef GIF_RECORD_BITRATE
            #define GIF_RECORD_BITRATE 16
            #endif

            // Add the frame to the gif recording, given how many frames have passed in centiseconds
            msf_gif_frame(&gifState, screenData, gifFrameCounter/10, GIF_RECORD_BITRATE, (int)((float)CORE.Window.render.width*scale.x)*4);
            gifFrameCounter -= 1000/GIF_RECORD_FRAMERATE;

            RL_FREE(screenData);    // Free image data
        }

    #if defined(SUPPORT_MODULE_RSHAPES) && defined(SUPPORT_MODULE_RTEXT)
        // Display the recording indicator every half-second
        if ((int)(GetTime()/0.5)%2 == 1)
        {
            DrawCircle(30, CORE.Window.screen.height - 20, 10, MAROON);                 // WARNING: Module required: rshapes
            DrawText("GIF RECORDING", 50, CORE.Window.screen.height - 25, 10, RED);     // WARNING: Module required: rtext
        }
    #endif

        rlDrawRenderBatchActive();  // Update and draw internal render batch
    }
#endif

#if defined(SUPPORT_AUTOMATION_EVENTS)
    if (automationEventRecording) RecordAutomationEvent();    // Event recording
#endif

#if !defined(SUPPORT_CUSTOM_FRAME_CONTROL)
    SwapScreenBuffer();                  // Copy back buffer to front buffer (screen)

    // Frame time control system
    CORE.Time.current = GetTime();
    CORE.Time.draw = CORE.Time.current - CORE.Time.previous;
    CORE.Time.previous = CORE.Time.current;

    CORE.Time.frame = CORE.Time.update + CORE.Time.draw;

    // Wait for some milliseconds...
    if (CORE.Time.frame < CORE.Time.target)
    {
        WaitTime(CORE.Time.target - CORE.Time.frame);

        CORE.Time.current = GetTime();
        double waitTime = CORE.Time.current - CORE.Time.previous;
        CORE.Time.previous = CORE.Time.current;

        CORE.Time.frame += waitTime;    // Total frame time: update + draw + wait
    }

    PollInputEvents();      // Poll user events (before next frame update)
#endif

#if defined(SUPPORT_SCREEN_CAPTURE)
    if (IsKeyPressed(KEY_F12))
    {
#if defined(SUPPORT_GIF_RECORDING)
        if (IsKeyDown(KEY_LEFT_CONTROL))
        {
            if (gifRecording)
            {
                gifRecording = false;

                MsfGifResult result = msf_gif_end(&gifState);

                SaveFileData(TextFormat("%s/screenrec%03i.gif", CORE.Storage.basePath, screenshotCounter), result.data, (unsigned int)result.dataSize);
                msf_gif_free(result);

                TRACELOG(LOG_INFO, "SYSTEM: Finish animated GIF recording");
            }
            else
            {
                gifRecording = true;
                gifFrameCounter = 0;

                Vector2 scale = GetWindowScaleDPI();
                msf_gif_begin(&gifState, (int)((float)CORE.Window.render.width*scale.x), (int)((float)CORE.Window.render.height*scale.y));
                screenshotCounter++;

                TRACELOG(LOG_INFO, "SYSTEM: Start animated GIF recording: %s", TextFormat("screenrec%03i.gif", screenshotCounter));
            }
        }
        else
#endif  // SUPPORT_GIF_RECORDING
        {
            TakeScreenshot(TextFormat("screenshot%03i.png", screenshotCounter));
            screenshotCounter++;
        }
    }
#endif  // SUPPORT_SCREEN_CAPTURE

    CORE.Time.frameCounter++;
}